

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O1

void __thiscall helics::ConnectorFederateManager::closeAllConnectors(ConnectorFederateManager *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *puVar4;
  ulong uVar5;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar6;
  Translator **ppTVar7;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar8;
  Translator *this_00;
  Translator **ppTVar9;
  handle trans;
  handle filts;
  handle local_60;
  handle local_48;
  
  if (this->coreObject == (Core *)0x0) {
    return;
  }
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_48,&this->filters);
  if (((local_48.data)->dataStorage).csize == 0) {
    uVar5 = (ulong)((local_48.data)->dataStorage).bsize;
    ppuVar8 = ((local_48.data)->dataStorage).dataptr;
    if (uVar5 == 0x20) {
      if (ppuVar8 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
        ppuVar8 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
                  &gmlc::containers::
                   StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
                   ::end()::emptyValue;
      }
      else {
        ppuVar8 = ppuVar8 + (long)((local_48.data)->dataStorage).dataSlotIndex + 1;
      }
      goto LAB_00221b37;
    }
    ppuVar8 = ppuVar8 + ((local_48.data)->dataStorage).dataSlotIndex;
    puVar4 = *ppuVar8 + uVar5;
  }
  else {
    ppuVar8 = ((local_48.data)->dataStorage).dataptr;
LAB_00221b37:
    puVar4 = *ppuVar8;
    uVar5 = 0;
  }
  iVar2 = ((local_48.data)->dataStorage).bsize;
  ppuVar6 = ((local_48.data)->dataStorage).dataptr;
  if (iVar2 == 0x20) {
    if (ppuVar6 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
      ppuVar6 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
                &gmlc::containers::
                 StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
                 ::end()::emptyValue;
    }
    else {
      ppuVar6 = ppuVar6 + (long)((local_48.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar2 = 0;
  }
  else {
    ppuVar6 = ppuVar6 + ((local_48.data)->dataStorage).dataSlotIndex;
  }
  while ((iVar3 = (int)uVar5, iVar3 != iVar2 || (ppuVar8 != ppuVar6))) {
    (*this->coreObject->_vptr_Core[0x30])
              (this->coreObject,
               (ulong)(uint)(((puVar4->_M_t).
                              super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>
                              .super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl)->
                            super_Interface).handle.hid);
    Interface::disconnectFromCore
              (&((puVar4->_M_t).
                 super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
                 super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl)->super_Interface);
    uVar1 = iVar3 + 1;
    if (iVar3 < 0x1f) {
      puVar4 = puVar4 + 1;
    }
    else {
      ppuVar8 = ppuVar8 + (ulong)(iVar3 - 0x1fU >> 5) + 1;
      uVar1 = uVar1 & 0x1f;
      puVar4 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
               ((long)&((*ppuVar8)->_M_t).
                       super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>
                       .super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl +
               (ulong)(uVar1 * 8));
    }
    uVar5 = (ulong)uVar1;
  }
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_60,&this->translators);
  if (((local_60.data)->dataStorage).csize == 0) {
    uVar5 = (ulong)((local_60.data)->dataStorage).bsize;
    ppTVar9 = ((local_60.data)->dataStorage).dataptr;
    if (uVar5 != 0x20) {
      ppTVar9 = ppTVar9 + ((local_60.data)->dataStorage).dataSlotIndex;
      this_00 = *ppTVar9 + uVar5;
      goto LAB_00221c15;
    }
    if (ppTVar9 == (Translator **)0x0) {
      ppTVar9 = &gmlc::containers::
                 StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::end
                 ::emptyValue;
    }
    else {
      ppTVar9 = ppTVar9 + (long)((local_60.data)->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppTVar9 = ((local_60.data)->dataStorage).dataptr;
  }
  this_00 = *ppTVar9;
  uVar5 = 0;
LAB_00221c15:
  iVar2 = ((local_60.data)->dataStorage).bsize;
  ppTVar7 = ((local_60.data)->dataStorage).dataptr;
  if (iVar2 == 0x20) {
    if (ppTVar7 == (Translator **)0x0) {
      ppTVar7 = &gmlc::containers::
                 StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::end
                 ::emptyValue;
    }
    else {
      ppTVar7 = ppTVar7 + (long)((local_60.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar2 = 0;
  }
  else {
    ppTVar7 = ppTVar7 + ((local_60.data)->dataStorage).dataSlotIndex;
  }
  while ((iVar3 = (int)uVar5, iVar3 != iVar2 || (ppTVar9 != ppTVar7))) {
    (*this->coreObject->_vptr_Core[0x30])
              (this->coreObject,(ulong)(uint)(this_00->super_Interface).handle.hid);
    Interface::disconnectFromCore(&this_00->super_Interface);
    uVar1 = iVar3 + 1;
    if (iVar3 < 0x1f) {
      this_00 = this_00 + 1;
    }
    else {
      ppTVar9 = ppTVar9 + (ulong)(iVar3 - 0x1fU >> 5) + 1;
      uVar1 = uVar1 & 0x1f;
      this_00 = (Translator *)
                ((long)&((*ppTVar9)->super_Interface)._vptr_Interface + (ulong)(uVar1 * 0x50));
    }
    uVar5 = (ulong)uVar1;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_60.m_handle_lock);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
  return;
}

Assistant:

void ConnectorFederateManager::closeAllConnectors()
{
    if (coreObject != nullptr) {
        auto filts = filters.lock();
        filts->modify([this](auto& filt) {
            coreObject->closeHandle(filt->getHandle());
            filt->disconnectFromCore();
        });

        auto trans = translators.lock();
        trans->modify([this](auto& tran) {
            coreObject->closeHandle(tran.getHandle());
            tran.disconnectFromCore();
        });
    }
}